

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

void spki_table_notify_diff(spki_table *new_table,spki_table *old_table,rtr_socket *socket)

{
  long lVar1;
  spki_update_fp p_Var2;
  spki_update_fp p_Var3;
  int iVar4;
  long lVar5;
  tommy_list ptVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  spki_record *psVar9;
  uint8_t *puVar10;
  undefined8 *puVar11;
  long in_FS_OFFSET;
  byte bVar12;
  spki_record in_stack_fffffffffffffeb8;
  spki_record record;
  
  bVar12 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = old_table->update_fp;
  old_table->update_fp = (spki_update_fp)0x0;
  ptVar6 = (tommy_list)&new_table->list;
  while (ptVar6 = ptVar6->next, ptVar6 != (tommy_list)0x0) {
    puVar8 = (uint8_t *)ptVar6->data;
    if (*(rtr_socket **)(puVar8 + 0x78) == socket) {
      record.asn = *(uint32_t *)(puVar8 + 0x14);
      record.ski._0_8_ = *(undefined8 *)puVar8;
      record.ski._8_8_ = *(undefined8 *)(puVar8 + 8);
      record.ski._16_4_ = *(undefined4 *)(puVar8 + 0x10);
      puVar7 = puVar8 + 0x18;
      puVar10 = record.spki;
      record.socket = *(rtr_socket **)(puVar8 + 0x78);
      for (lVar5 = 0x5b; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar10 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
      }
      iVar4 = spki_table_remove_entry(old_table,&record);
      if ((iVar4 == -3) && (p_Var3 = new_table->update_fp, p_Var3 != (spki_update_fp)0x0)) {
        psVar9 = &record;
        puVar11 = (undefined8 *)&stack0xfffffffffffffeb8;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar11 = *(undefined8 *)psVar9->ski;
          psVar9 = (spki_record *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
          puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
        }
        (*p_Var3)(new_table,in_stack_fffffffffffffeb8,true);
      }
    }
  }
  ptVar6 = (tommy_list)&old_table->list;
  while (ptVar6 = ptVar6->next, ptVar6 != (tommy_list)0x0) {
    puVar8 = (uint8_t *)ptVar6->data;
    if (*(rtr_socket **)(puVar8 + 0x78) == socket) {
      record.asn = *(uint32_t *)(puVar8 + 0x14);
      record.socket = *(rtr_socket **)(puVar8 + 0x78);
      record.ski._0_8_ = *(undefined8 *)puVar8;
      record.ski._8_8_ = *(undefined8 *)(puVar8 + 8);
      record.ski._16_4_ = *(undefined4 *)(puVar8 + 0x10);
      puVar8 = puVar8 + 0x18;
      puVar7 = record.spki;
      for (lVar5 = 0x5b; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
      }
      p_Var3 = new_table->update_fp;
      if (p_Var3 != (spki_update_fp)0x0) {
        psVar9 = &record;
        puVar11 = (undefined8 *)&stack0xfffffffffffffeb8;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar11 = *(undefined8 *)psVar9->ski;
          psVar9 = (spki_record *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
          puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
        }
        (*p_Var3)(new_table,in_stack_fffffffffffffeb8,false);
      }
    }
  }
  old_table->update_fp = p_Var2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_notify_diff(struct spki_table *new_table, struct spki_table *old_table, const struct rtr_socket *socket)
{
	spki_update_fp old_table_fp;

	// Disable update callback for old_table
	old_table_fp = old_table->update_fp;
	old_table->update_fp = NULL;

	// Iterate new_table and try to delete every entry from the given socket
	// in old_table If the prefix could not be removed it was added in
	// new_table and the update cb must be called
	for (tommy_node *current_node = tommy_list_head(&new_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);

			if (spki_table_remove_entry(old_table, &record) == SPKI_RECORD_NOT_FOUND)
				spki_table_notify_clients(new_table, &record, true);
		}
	}

	// Iterate old_table and call cb for every remianing entry from the
	// given socket with added false because it is not present in new_table
	for (tommy_node *current_node = tommy_list_head(&old_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);
			spki_table_notify_clients(new_table, &record, false);
		}
	}

	// Restore original state of old_tables update_fp
	old_table->update_fp = old_table_fp;
}